

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxLexer.cpp
# Opt level: O1

void __thiscall Jinx::Impl::Lexer::CreateSymbol(Lexer *this,string_view name)

{
  String *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_11
  *paVar1;
  ulong uVar2;
  size_type __len1;
  _Alloc_hider __s;
  bool bVar3;
  int iVar4;
  size_t __len2;
  const_iterator cVar5;
  char *pcVar6;
  char *extraout_RDX;
  Impl *this_01;
  string_view source;
  string_view source_00;
  Symbol symbol;
  value_type local_80;
  String local_48;
  
  source_00._M_len = name._M_str;
  this_01 = (Impl *)name._M_len;
  uVar2._0_4_ = this->m_columnMarker;
  uVar2._4_4_ = this->m_lineNumber;
  local_80._48_8_ = uVar2 << 0x20 | uVar2 >> 0x20;
  this_00 = &local_80.text;
  local_80.type = NameValue;
  paVar1 = &local_80.text.field_2;
  local_80.text._M_string_length = 0;
  local_80.text.field_2._M_local_buf[0] = '\0';
  local_80.field_2.numVal = 0.0;
  pcVar6 = source_00._M_len;
  local_80.text._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::_M_replace
            (this_00,0,0,source_00._M_len,(size_type)this_01);
  source._M_str = extraout_RDX;
  source._M_len = (size_t)source_00._M_len;
  bVar3 = IsCaseFolded(this_01,source);
  if (!bVar3) {
    source_00._M_str = pcVar6;
    FoldCase_abi_cxx11_(&local_48,this_01,source_00);
    __s._M_p = local_48._M_dataplus._M_p;
    __len1 = local_80.text._M_string_length;
    __len2 = strlen(local_48._M_dataplus._M_p);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::_M_replace
              (this_00,0,__len1,__s._M_p,__len2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      MemFree(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
  }
  local_48._M_dataplus._M_p = (pointer)local_80.text._M_string_length;
  local_48._M_string_length = (size_type)local_80.text._M_dataplus._M_p;
  cVar5 = std::
          _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_Jinx::Impl::SymbolType>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_Jinx::Impl::SymbolType>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_Jinx::StaticAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_Jinx::Impl::SymbolType>,_4096UL,_16UL>_>
          ::find(&this->m_symbolTypeMap->_M_t,(key_type *)&local_48);
  if ((_Rb_tree_header *)cVar5._M_node ==
      &(this->m_symbolTypeMap->_M_t)._M_impl.super__Rb_tree_header) {
    iVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::
            compare(this_00,"true");
    if (iVar4 == 0) {
      local_80.type = BooleanValue;
      local_80.field_2.boolVal = true;
    }
    else {
      iVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::
              compare(this_00,"false");
      if (iVar4 == 0) {
        local_80.type = BooleanValue;
        local_80.field_2.intVal = local_80.field_2.intVal & 0xffffffffffffff00;
      }
    }
  }
  else {
    local_80.type = *(SymbolType *)&cVar5._M_node[1]._M_left;
  }
  std::vector<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>::push_back
            (&this->m_symbolList,&local_80);
  this->m_columnMarker = this->m_columnNumber;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_11
       *)local_80.text._M_dataplus._M_p != paVar1) {
    MemFree(local_80.text._M_dataplus._M_p,
            CONCAT71(local_80.text.field_2._M_allocated_capacity._1_7_,
                     local_80.text.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

inline_t void Lexer::CreateSymbol(std::string_view name)
	{
		Symbol symbol(SymbolType::NameValue, m_lineNumber, m_columnMarker);
		symbol.text = name;
		if (!IsCaseFolded(name))
			symbol.text = FoldCase(name).c_str();
		auto itr = m_symbolTypeMap.find(symbol.text);
		if (itr != m_symbolTypeMap.end())
		{
			symbol.type = itr->second;
		}
		else
		{
			// Special case detection of boolean 'true' and 'false' values.  We don't
			// want to make these symbol types.  Instead, they need to be a BooleanValue
			// type.
			if (symbol.text == "true")
			{
				symbol.type = SymbolType::BooleanValue;
				symbol.boolVal = true;
			}
			else if (symbol.text == "false")
			{
				symbol.type = SymbolType::BooleanValue;
				symbol.boolVal = false;
			}
		}
		m_symbolList.push_back(symbol);
		m_columnMarker = m_columnNumber;
	}